

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O0

void sshproxy_notify_remote_disconnect_callback(void *vctx)

{
  _Bool _Var1;
  SshProxy *sp;
  void *vctx_local;
  
  _Var1 = backend_connected(*(Backend **)((long)vctx + 0x18));
  if (!_Var1) {
    sshproxy_send_close((SshProxy *)vctx);
  }
  return;
}

Assistant:

static void sshproxy_notify_remote_disconnect_callback(void *vctx)
{
    SshProxy *sp = (SshProxy *)vctx;

    /* notify_remote_disconnect can be called redundantly, so first
     * check if the backend really has become disconnected */
    if (backend_connected(sp->backend))
        return;

    sshproxy_send_close(sp);
}